

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linux.hpp
# Opt level: O1

int getKey(void)

{
  char cVar1;
  int iVar2;
  
  cVar1 = getch();
  if (cVar1 == '\x1b') {
    cVar1 = getch();
    if (cVar1 == '[') {
      cVar1 = getch();
      iVar2 = (int)cVar1 << 8;
    }
    else {
      iVar2 = (int)cVar1;
      perror("Esc is unsupported!");
    }
  }
  else {
    iVar2 = (int)cVar1;
  }
  return iVar2;
}

Assistant:

int getKey() {
    int key = getch();
    // 禁止ESC
    if (key == 27) {
        key = getch();
        if (key != 91) {
            perror("Esc is unsupported!");
        } else {
            key = getch();
            key = key << 8;
        }
    }
    return key;
}